

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::handleLoadWallet(WalletLoaderImpl *this,LoadWalletFn fn)

{
  long lVar1;
  _Invoker_type p_Var2;
  _Manager_type p_Var3;
  LoadWalletFn load_wallet;
  undefined8 *in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  undefined8 uVar4;
  undefined8 uVar5;
  _Manager_type p_Var6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (void *)0x0;
  uVar5 = 0;
  p_Var2 = (_Invoker_type)in_RDX[3];
  p_Var3 = (_Manager_type)in_RDX[2];
  p_Var6 = (_Manager_type)0x0;
  if (p_Var3 != (_Manager_type)0x0) {
    uVar4 = *in_RDX;
    uVar5 = in_RDX[1];
    in_RDX[2] = 0;
    in_RDX[3] = 0;
    p_Var6 = p_Var3;
  }
  load_wallet.super__Function_base._M_functor._8_8_ = uVar5;
  load_wallet.super__Function_base._M_functor._M_unused._M_object = (void *)uVar4;
  load_wallet.super__Function_base._M_manager = p_Var6;
  load_wallet._M_invoker = p_Var2;
  HandleLoadWallet((wallet *)this,(WalletContext *)(in_RSI + 8),load_wallet);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleLoadWallet(LoadWalletFn fn) override
    {
        return HandleLoadWallet(m_context, std::move(fn));
    }